

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O2

void __thiscall QGuiApplication::~QGuiApplication(QGuiApplication *this)

{
  long lVar1;
  QIcon *pQVar2;
  QString *pQVar3;
  QThreadPool *pQVar4;
  QDeadlineTimer QVar5;
  
  *(undefined ***)this = &PTR_metaObject_0077d730;
  lVar1 = *(long *)&this->field_0x8;
  qt_call_post_routines();
  (**(code **)(*QCoreApplicationPrivate::eventDispatcher + 0xb8))();
  QCoreApplicationPrivate::eventDispatcher = (long *)0x0;
  if (QGuiApplicationPrivate::qt_clipboard != (QClipboard *)0x0) {
    (**(code **)(*(long *)QGuiApplicationPrivate::qt_clipboard + 0x20))();
  }
  QGuiApplicationPrivate::qt_clipboard = (QClipboard *)0x0;
  if (*(long **)(lVar1 + 0x148) != (long *)0x0) {
    (**(code **)(**(long **)(lVar1 + 0x148) + 0x20))();
  }
  *(undefined8 *)(lVar1 + 0x148) = 0;
  QGuiApplicationPrivate::clearPalette();
  QFontDatabase::removeAllApplicationFonts();
  QList<QCursor>::clear((QList<QCursor> *)(lVar1 + 0x100));
  pQVar4 = QGuiApplicationPrivate::qtGuiThreadPool();
  if (pQVar4 != (QThreadPool *)0x0) {
    QVar5.t2 = 0xffffffff;
    QVar5.type = 0x7fffffff;
    QVar5.t1 = (qint64)pQVar4;
    QThreadPool::waitForDone(QVar5);
    (**(code **)(*(long *)pQVar4 + 0x20))(pQVar4);
  }
  pQVar2 = QGuiApplicationPrivate::app_icon;
  if (QGuiApplicationPrivate::app_icon != (QIcon *)0x0) {
    QIcon::~QIcon(QGuiApplicationPrivate::app_icon);
  }
  operator_delete(pQVar2,8);
  pQVar3 = QGuiApplicationPrivate::platform_name;
  QGuiApplicationPrivate::app_icon = (QIcon *)0x0;
  if (QGuiApplicationPrivate::platform_name != (QString *)0x0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QGuiApplicationPrivate::platform_name->d);
  }
  operator_delete(pQVar3,0x18);
  pQVar3 = QGuiApplicationPrivate::displayName;
  QGuiApplicationPrivate::platform_name = (QString *)0x0;
  if (QGuiApplicationPrivate::displayName != (QString *)0x0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QGuiApplicationPrivate::displayName->d);
  }
  operator_delete(pQVar3,0x18);
  QGuiApplicationPrivate::displayName = (QString *)0x0;
  if (QGuiApplicationPrivate::m_inputDeviceManager != (QInputDeviceManager *)0x0) {
    (**(code **)(*(long *)QGuiApplicationPrivate::m_inputDeviceManager + 0x20))();
  }
  pQVar3 = QGuiApplicationPrivate::desktopFileName;
  QGuiApplicationPrivate::m_inputDeviceManager = (QInputDeviceManager *)0x0;
  if (QGuiApplicationPrivate::desktopFileName != (QString *)0x0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QGuiApplicationPrivate::desktopFileName->d);
  }
  operator_delete(pQVar3,0x18);
  QGuiApplicationPrivate::desktopFileName = (QString *)0x0;
  QGuiApplicationPrivate::mouse_buttons.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
  super_QFlagsStorage<Qt::MouseButton>.i =
       (QFlagsStorageHelper<Qt::MouseButton,_4>)(QFlagsStorage<Qt::MouseButton>)0x0;
  QGuiApplicationPrivate::modifier_buttons.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
  super_QFlagsStorage<Qt::KeyboardModifier>.i =
       (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)(QFlagsStorage<Qt::KeyboardModifier>)0x0;
  QGuiApplicationPrivate::lastCursorPosition.thePoint.xp = 8388608.0;
  QGuiApplicationPrivate::lastCursorPosition.thePoint.yp = 8388608.0;
  QGuiApplicationPrivate::currentMouseWindow = (QWindow *)0x0;
  QGuiApplicationPrivate::currentMousePressWindow = (QWindow *)0x0;
  QGuiApplicationPrivate::applicationState = ApplicationInactive;
  QGuiApplicationPrivate::highDpiScaleFactorRoundingPolicy = PassThrough;
  QWeakPointer<QObject>::assign<QObject>
            (&QGuiApplicationPrivate::currentDragWindow.wp,(QObject *)0x0);
  QList<QGuiApplicationPrivate::TabletPointData>::clear(&QGuiApplicationPrivate::tabletDevicePoints)
  ;
  QCoreApplication::~QCoreApplication(&this->super_QCoreApplication);
  return;
}

Assistant:

QGuiApplication::~QGuiApplication()
{
    Q_D(QGuiApplication);

    qt_call_post_routines();

    d->eventDispatcher->closingDown();
    d->eventDispatcher = nullptr;

#ifndef QT_NO_CLIPBOARD
    delete QGuiApplicationPrivate::qt_clipboard;
    QGuiApplicationPrivate::qt_clipboard = nullptr;
#endif

#ifndef QT_NO_SESSIONMANAGER
    delete d->session_manager;
    d->session_manager = nullptr;
#endif //QT_NO_SESSIONMANAGER

    QGuiApplicationPrivate::clearPalette();
    QFontDatabase::removeAllApplicationFonts();

#ifndef QT_NO_CURSOR
    d->cursor_list.clear();
#endif

#if QT_CONFIG(qtgui_threadpool)
    // Synchronize and stop the gui thread pool threads.
    QThreadPool *guiThreadPool = nullptr;
    QT_TRY {
        guiThreadPool = QGuiApplicationPrivate::qtGuiThreadPool();
    } QT_CATCH (...) {
        // swallow the exception, since destructors shouldn't throw
    }
    if (guiThreadPool) {
        guiThreadPool->waitForDone();
        delete guiThreadPool;
    }
#endif

    delete QGuiApplicationPrivate::app_icon;
    QGuiApplicationPrivate::app_icon = nullptr;
    delete QGuiApplicationPrivate::platform_name;
    QGuiApplicationPrivate::platform_name = nullptr;
    delete QGuiApplicationPrivate::displayName;
    QGuiApplicationPrivate::displayName = nullptr;
    delete QGuiApplicationPrivate::m_inputDeviceManager;
    QGuiApplicationPrivate::m_inputDeviceManager = nullptr;
    delete QGuiApplicationPrivate::desktopFileName;
    QGuiApplicationPrivate::desktopFileName = nullptr;
    QGuiApplicationPrivate::mouse_buttons = Qt::NoButton;
    QGuiApplicationPrivate::modifier_buttons = Qt::NoModifier;
    QGuiApplicationPrivate::lastCursorPosition.reset();
    QGuiApplicationPrivate::currentMousePressWindow = QGuiApplicationPrivate::currentMouseWindow = nullptr;
    QGuiApplicationPrivate::applicationState = Qt::ApplicationInactive;
    QGuiApplicationPrivate::highDpiScaleFactorRoundingPolicy = Qt::HighDpiScaleFactorRoundingPolicy::PassThrough;
    QGuiApplicationPrivate::currentDragWindow = nullptr;
    QGuiApplicationPrivate::tabletDevicePoints.clear();
}